

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O1

int address_from_private_key
              (uchar *bytes,size_t bytes_len,uchar network,_Bool compressed,char **output)

{
  int iVar1;
  uchar *bytes_out;
  anon_struct_24_2_b3b0cfa8 buf;
  uchar pub_key_short [33];
  sha256 sha;
  uchar pub_key_long [65];
  
  bytes_out = pub_key_short;
  iVar1 = wally_ec_public_key_from_private_key(bytes,bytes_len,bytes_out,0x21);
  if (iVar1 == 0 && !compressed) {
    bytes_out = pub_key_long;
    iVar1 = wally_ec_public_key_decompress(pub_key_short,0x21,bytes_out,0x41);
  }
  if (iVar1 == 0) {
    sha256(&sha,bytes_out,(ulong)!compressed * 0x20 + 0x21);
    ripemd160(&buf.hash160,&sha,0x20);
    buf.network_bytes.bytes[3] = network;
    iVar1 = wally_base58_from_bytes(buf.network_bytes.bytes + 3,0x15,1,output);
  }
  wally_clear_4(&sha,0x20,pub_key_short,0x21,pub_key_long,0x41,&buf,0x18);
  return iVar1;
}

Assistant:

static int address_from_private_key(const unsigned char *bytes,
                                    size_t bytes_len,
                                    unsigned char network,
                                    bool compressed,
                                    char **output)
{
    struct sha256 sha;
    unsigned char pub_key_short[EC_PUBLIC_KEY_LEN];
    unsigned char pub_key_long[EC_PUBLIC_KEY_UNCOMPRESSED_LEN];
    unsigned char *pub_key = pub_key_short;
    size_t pub_key_len = compressed ? EC_PUBLIC_KEY_LEN : EC_PUBLIC_KEY_UNCOMPRESSED_LEN;
    struct {
        union {
            uint32_t network;
            unsigned char bytes[4];
        } network_bytes; /* Used for alignment */
        struct ripemd160 hash160;
    } buf;
    int ret;

    /* Network and hash160 must be contiguous */
    BUILD_ASSERT(sizeof(buf) == sizeof(struct ripemd160) + sizeof(uint32_t));

    ret = wally_ec_public_key_from_private_key(bytes, bytes_len,
                                               pub_key_short, sizeof(pub_key_short));
    if (ret == WALLY_OK && !compressed) {
        ret = wally_ec_public_key_decompress(pub_key_short, sizeof(pub_key_short),
                                             pub_key_long, sizeof(pub_key_long));
        pub_key = pub_key_long;
    }
    if (ret == WALLY_OK) {
        sha256(&sha, pub_key, pub_key_len);
        ripemd160(&buf.hash160, &sha, sizeof(sha));
        buf.network_bytes.bytes[3] = network;
        ret = wally_base58_from_bytes(&buf.network_bytes.bytes[3],
                                      sizeof(unsigned char) + sizeof(buf.hash160),
                                      BASE58_FLAG_CHECKSUM, output);
    }
    wally_clear_4(&sha, sizeof(sha), pub_key_short, sizeof(pub_key_short),
                  pub_key_long, sizeof(pub_key_long), &buf, sizeof(buf));
    return ret;
}